

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

void __thiscall CNode::CloseSocketDisconnect(CNode *this)

{
  long lVar1;
  string_view logging_function;
  bool bVar2;
  char *in_RDI;
  long in_FS_OFFSET;
  ConstevalFormatString<1U> in_stack_00000028;
  undefined1 in_stack_00000030 [16];
  size_t in_stack_00000040;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock30;
  Level in_stack_00000120;
  long *in_stack_00000130;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  __shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2> *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 uVar3;
  char *in_stack_ffffffffffffffa8;
  AnnotatedMixin<std::mutex> *in_stack_ffffffffffffffb0;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_ffffffffffffffb8;
  LogFlags in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffec;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::atomic<bool>::operator=
            ((atomic<bool> *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),false);
  MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_RDI,
             in_stack_ffffffffffffff9c,SUB41((uint)in_stack_ffffffffffffff98 >> 0x18,0));
  bVar2 = std::__shared_ptr::operator_cast_to_bool
                    ((__shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2> *)
                     CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  if (bVar2) {
    bVar2 = ::LogAcceptCategory(CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),Trace)
    ;
    uVar3 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff9c);
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(uVar3,in_stack_ffffffffffffff98),in_stack_ffffffffffffff90);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(uVar3,in_stack_ffffffffffffff98),in_stack_ffffffffffffff90);
      in_stack_ffffffffffffff88 = (__shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2> *)(in_RDI + 0x270)
      ;
      in_stack_ffffffffffffff78 = 1;
      logging_function._M_str = (char *)this;
      logging_function._M_len = in_stack_00000040;
      LogPrintFormatInternal<long>
                (logging_function,(string_view)in_stack_00000030,in_stack_ffffffffffffffec,
                 in_stack_ffffffffffffffe0,in_stack_00000120,in_stack_00000028,in_stack_00000130);
    }
    std::__shared_ptr<Sock,_(__gnu_cxx::_Lock_policy)2>::reset(in_stack_ffffffffffffff88);
  }
  std::unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_>::reset
            ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),(pointer)0x2066ca);
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CNode::CloseSocketDisconnect()
{
    fDisconnect = true;
    LOCK(m_sock_mutex);
    if (m_sock) {
        LogDebug(BCLog::NET, "disconnecting peer=%d\n", id);
        m_sock.reset();
    }
    m_i2p_sam_session.reset();
}